

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3DbStrDup(sqlite3 *db,char *z)

{
  int iVar1;
  size_t n;
  char *zNew;
  char *z_local;
  sqlite3 *db_local;
  
  if (z == (char *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    iVar1 = sqlite3Strlen30(z);
    db_local = (sqlite3 *)sqlite3DbMallocRaw(db,iVar1 + 1);
    if (db_local != (sqlite3 *)0x0) {
      memcpy(db_local,z,(long)(iVar1 + 1));
    }
  }
  return (char *)db_local;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrDup(sqlite3 *db, const char *z){
  char *zNew;
  size_t n;
  if( z==0 ){
    return 0;
  }
  n = sqlite3Strlen30(z) + 1;
  assert( (n&0x7fffffff)==n );
  zNew = sqlite3DbMallocRaw(db, (int)n);
  if( zNew ){
    memcpy(zNew, z, n);
  }
  return zNew;
}